

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AccumLiteral
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,
          MatchLiteralNode *deferredLiteralNode,Node *charOrLiteralNode)

{
  code *pcVar1;
  bool bVar2;
  CharCount size;
  undefined4 *puVar3;
  CharCount addLen;
  Node *charOrLiteralNode_local;
  MatchLiteralNode *deferredLiteralNode_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  if ((charOrLiteralNode->tag != MatchChar) && (charOrLiteralNode->tag != MatchLiteral)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x333,
                       "(charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral)"
                       ,
                       "charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  size = (**charOrLiteralNode->_vptr_Node)();
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x335,"(addLen > 0)","addLen > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (deferredLiteralNode->length == 0) {
    EnsureLitbuf(this,size);
    deferredLiteralNode->offset = this->litbufNext;
    deferredLiteralNode->length = size;
    (*charOrLiteralNode->_vptr_Node[1])
              (charOrLiteralNode,&this->litbufNext,(ulong)this->litbufLen,this->litbuf);
  }
  else if (deferredLiteralNode->offset + deferredLiteralNode->length == this->litbufNext) {
    EnsureLitbuf(this,size);
    (*charOrLiteralNode->_vptr_Node[1])
              (charOrLiteralNode,&this->litbufNext,(ulong)this->litbufLen,this->litbuf);
    deferredLiteralNode->length = size + deferredLiteralNode->length;
  }
  else if ((charOrLiteralNode->tag == MatchLiteral) &&
          (deferredLiteralNode->offset + deferredLiteralNode->length ==
           *(int *)&charOrLiteralNode[1]._vptr_Node)) {
    deferredLiteralNode->length = size + deferredLiteralNode->length;
  }
  else {
    EnsureLitbuf(this,deferredLiteralNode->length + size);
    js_wmemcpy_s(this->litbuf + this->litbufNext,(ulong)(this->litbufLen - this->litbufNext),
                 this->litbuf + deferredLiteralNode->offset,(ulong)deferredLiteralNode->length);
    deferredLiteralNode->offset = this->litbufNext;
    this->litbufNext = deferredLiteralNode->length + this->litbufNext;
    (*charOrLiteralNode->_vptr_Node[1])
              (charOrLiteralNode,&this->litbufNext,(ulong)this->litbufLen,this->litbuf);
    deferredLiteralNode->length = size + deferredLiteralNode->length;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::AccumLiteral(MatchLiteralNode* deferredLiteralNode, Node* charOrLiteralNode)
    {
        Assert(charOrLiteralNode->tag == Node::MatchChar || charOrLiteralNode->tag == Node::MatchLiteral);
        CharCount addLen = charOrLiteralNode->LiteralLength();
        Assert(addLen > 0);

        if (deferredLiteralNode->length == 0)
        {
            // Start a new literal
            EnsureLitbuf(addLen);
            deferredLiteralNode->offset = litbufNext;
            deferredLiteralNode->length = addLen;
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
        }
        else if (deferredLiteralNode->offset + deferredLiteralNode->length == litbufNext)
        {
            // Keep growing the current literal
            EnsureLitbuf(addLen);
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
            deferredLiteralNode->length += addLen;

        }
        else if (charOrLiteralNode->tag == Node::MatchLiteral && deferredLiteralNode->offset + deferredLiteralNode->length == ((MatchLiteralNode*)charOrLiteralNode)->offset)
        {
            // Absorb next literal into current literal since they are adjacent
            deferredLiteralNode->length += addLen;
        }
        else
        {
            // Abandon current literal and start a fresh one (leaves gap)
            EnsureLitbuf(deferredLiteralNode->length + addLen);
            js_wmemcpy_s(litbuf + litbufNext, litbufLen - litbufNext, litbuf + deferredLiteralNode->offset, deferredLiteralNode->length);
            deferredLiteralNode->offset = litbufNext;
            litbufNext += deferredLiteralNode->length;
            charOrLiteralNode->AppendLiteral(litbufNext, litbufLen, litbuf);
            deferredLiteralNode->length += addLen;
        }
    }